

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

EulerAngles *
AML::integrateEulerAngles
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,EulerAngles *angleRates,double dt
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  EulerSequence EVar5;
  undefined4 uVar6;
  
  EVar5 = angles->seq_;
  if (EVar5 == angleRates->seq_) {
    dVar1 = angleRates->theta;
    dVar2 = angles->theta;
    dVar3 = angleRates->psi;
    dVar4 = angles->psi;
    __return_storage_ptr__->phi = angleRates->phi * dt + angles->phi;
    __return_storage_ptr__->theta = dVar1 * dt + dVar2;
    __return_storage_ptr__->psi = dt * dVar3 + dVar4;
    __return_storage_ptr__->seq_ = EVar5;
    return __return_storage_ptr__;
  }
  dVar1 = angles->phi;
  dVar2 = angles->theta;
  EVar5 = angles->seq_;
  uVar6 = *(undefined4 *)&angles->field_0x1c;
  __return_storage_ptr__->psi = angles->psi;
  __return_storage_ptr__->seq_ = EVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar6;
  __return_storage_ptr__->phi = dVar1;
  __return_storage_ptr__->theta = dVar2;
  return __return_storage_ptr__;
}

Assistant:

EulerAngles integrateEulerAngles(const EulerAngles& angles, const EulerAngles& angleRates, double dt)
    {
        EulerAngles::EulerSequence seq = angles.getEulerSequence();
        if (seq == angleRates.getEulerSequence())
        {
            double phiNew = angles.phi + angleRates.phi * dt;
            double thetaNew = angles.theta + angleRates.theta * dt;
            double psiNew = angles.psi + angleRates.psi * dt;
            return EulerAngles(phiNew, thetaNew, psiNew, seq);
        }
        return angles;
    }